

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O2

void NHandyPack::
     TVectorSerializer<std::vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>,_std::pair<unsigned_short,_unsigned_short>_>
     ::Dump(ostream *out,
           vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
           *object)

{
  pointer ppVar1;
  pair<unsigned_short,_unsigned_short> *obj;
  pointer object_00;
  undefined1 local_24 [8];
  uint32_t size;
  
  std::ostream::write((char *)out,(long)local_24);
  ppVar1 = (object->
           super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (object_00 = (object->
                   super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; object_00 != ppVar1;
      object_00 = object_00 + 1) {
    TSerializer<std::pair<unsigned_short,_unsigned_short>,_void>::Dump(out,object_00);
  }
  return;
}

Assistant:

static inline void Dump(std::ostream& out, const TVec& object) {
        uint32_t size = object.size();
        out.write((const char*)(&size), sizeof(size));
        for (const auto& obj: object) {
            NHandyPack::Dump(out, obj);
        }
    }